

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int arena_i_extent_hooks_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  int iVar1;
  uint uVar2;
  arena_t *paVar3;
  ehooks_t *peVar4;
  ulong uVar5;
  uint ind;
  size_t __n;
  arena_config_t config;
  extent_hooks_t *local_50;
  arena_config_t local_48;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar1 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  uVar5 = mib[1];
  iVar1 = 0xe;
  if (uVar5 >> 0x20 != 0) goto LAB_01c3a561;
  uVar2 = duckdb_je_narenas_total_get();
  ind = (uint)uVar5;
  if (uVar2 <= ind) goto LAB_01c3a561;
  paVar3 = (arena_t *)duckdb_je_arenas[uVar5].repr;
  if (paVar3 == (arena_t *)0x0) {
    iVar1 = 0xe;
    if (duckdb_je_narenas_auto <= ind) goto LAB_01c3a561;
    local_50 = &duckdb_je_ehooks_default_extent_hooks;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar5 = *oldlenp;
      if (uVar5 != 8) goto LAB_01c3a53b;
      *(extent_hooks_t **)oldp = &duckdb_je_ehooks_default_extent_hooks;
    }
    if (newp != (void *)0x0) {
      iVar1 = 0x16;
      if (newlen != 8) goto LAB_01c3a561;
      local_48.extent_hooks = *newp;
      local_48.metadata_use_hooks = true;
      local_48._9_7_ = 0;
      paVar3 = duckdb_je_arena_init((tsdn_t *)tsd,ind,&local_48);
      iVar1 = 0xe;
      if (paVar3 == (arena_t *)0x0) goto LAB_01c3a561;
    }
  }
  else {
    if (newp == (void *)0x0) {
      peVar4 = duckdb_je_arena_get_ehooks(paVar3);
      local_50 = (extent_hooks_t *)(peVar4->ptr).repr;
    }
    else {
      iVar1 = 0x16;
      if (newlen != 8) goto LAB_01c3a561;
      local_50 = duckdb_je_arena_set_extent_hooks(tsd,paVar3,*newp);
    }
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar5 = *oldlenp;
      if (uVar5 != 8) {
LAB_01c3a53b:
        __n = 8;
        if (uVar5 < 8) {
          __n = uVar5;
        }
        switchD_015de399::default(oldp,&local_50,__n);
        *oldlenp = __n;
        iVar1 = 0x16;
        goto LAB_01c3a561;
      }
      *(extent_hooks_t **)oldp = local_50;
    }
  }
  iVar1 = 0;
LAB_01c3a561:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar1;
}

Assistant:

static int
arena_i_extent_hooks_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	MIB_UNSIGNED(arena_ind, 1);
	if (arena_ind < narenas_total_get()) {
		extent_hooks_t *old_extent_hooks;
		arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
		if (arena == NULL) {
			if (arena_ind >= narenas_auto) {
				ret = EFAULT;
				goto label_return;
			}
			old_extent_hooks =
			    (extent_hooks_t *)&ehooks_default_extent_hooks;
			READ(old_extent_hooks, extent_hooks_t *);
			if (newp != NULL) {
				/* Initialize a new arena as a side effect. */
				extent_hooks_t *new_extent_hooks
				    JEMALLOC_CC_SILENCE_INIT(NULL);
				WRITE(new_extent_hooks, extent_hooks_t *);
				arena_config_t config = arena_config_default;
				config.extent_hooks = new_extent_hooks;

				arena = arena_init(tsd_tsdn(tsd), arena_ind,
				    &config);
				if (arena == NULL) {
					ret = EFAULT;
					goto label_return;
				}
			}
		} else {
			if (newp != NULL) {
				extent_hooks_t *new_extent_hooks
				    JEMALLOC_CC_SILENCE_INIT(NULL);
				WRITE(new_extent_hooks, extent_hooks_t *);
				old_extent_hooks = arena_set_extent_hooks(tsd,
				    arena, new_extent_hooks);
				READ(old_extent_hooks, extent_hooks_t *);
			} else {
				old_extent_hooks =
				    ehooks_get_extent_hooks_ptr(
					arena_get_ehooks(arena));
				READ(old_extent_hooks, extent_hooks_t *);
			}
		}
	} else {
		ret = EFAULT;
		goto label_return;
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}